

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptRegExp::DeleteProperty
          (JavascriptRegExp *this,JavascriptString *propertyNameString,PropertyOperationFlags flags)

{
  bool bVar1;
  ScriptContext *pSVar2;
  ScriptConfiguration *this_00;
  char16 *pcVar3;
  ScriptConfiguration *scriptConfig;
  PropertyOperationFlags flags_local;
  JavascriptString *propertyNameString_local;
  JavascriptRegExp *this_local;
  
  pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_00 = ScriptContext::GetConfig(pSVar2);
  bVar1 = BuiltInPropertyRecord<10>::Equals
                    ((BuiltInPropertyRecord<10> *)BuiltInPropertyRecords::lastIndex,
                     propertyNameString);
  if (bVar1) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pcVar3 = JavascriptString::GetString(propertyNameString);
    JavascriptError::ThrowCantDeleteIfStrictMode(flags,pSVar2,pcVar3);
    this_local._4_4_ = 0;
  }
  else {
    bVar1 = BuiltInPropertyRecord<7>::Equals
                      ((BuiltInPropertyRecord<7> *)BuiltInPropertyRecords::global,propertyNameString
                      );
    if ((((bVar1) ||
         (bVar1 = BuiltInPropertyRecord<10>::Equals
                            ((BuiltInPropertyRecord<10> *)BuiltInPropertyRecords::multiline,
                             propertyNameString), bVar1)) ||
        (bVar1 = BuiltInPropertyRecord<11>::Equals
                           ((BuiltInPropertyRecord<11> *)BuiltInPropertyRecords::ignoreCase,
                            propertyNameString), bVar1)) ||
       ((bVar1 = BuiltInPropertyRecord<7>::Equals
                           ((BuiltInPropertyRecord<7> *)BuiltInPropertyRecords::source,
                            propertyNameString), bVar1 ||
        (bVar1 = BuiltInPropertyRecord<8>::Equals
                           ((BuiltInPropertyRecord<8> *)BuiltInPropertyRecords::options,
                            propertyNameString), bVar1)))) {
      bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00);
      if (bVar1) {
        this_local._4_4_ =
             DynamicObject::DeleteProperty(&this->super_DynamicObject,propertyNameString,flags);
      }
      else {
        pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        pcVar3 = JavascriptString::GetString(propertyNameString);
        JavascriptError::ThrowCantDeleteIfStrictMode(flags,pSVar2,pcVar3);
        this_local._4_4_ = 0;
      }
    }
    else {
      bVar1 = BuiltInPropertyRecord<8>::Equals
                        ((BuiltInPropertyRecord<8> *)BuiltInPropertyRecords::unicode,
                         propertyNameString);
      if (bVar1) {
        bVar1 = ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
        if ((!bVar1) ||
           (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00), bVar1)) {
          this_local._4_4_ =
               DynamicObject::DeleteProperty(&this->super_DynamicObject,propertyNameString,flags);
        }
        else {
          pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
          pcVar3 = JavascriptString::GetString(propertyNameString);
          JavascriptError::ThrowCantDeleteIfStrictMode(flags,pSVar2,pcVar3);
          this_local._4_4_ = 0;
        }
      }
      else {
        bVar1 = BuiltInPropertyRecord<7>::Equals
                          ((BuiltInPropertyRecord<7> *)BuiltInPropertyRecords::dotAll,
                           propertyNameString);
        if (bVar1) {
          bVar1 = ScriptConfiguration::IsES2018RegExDotAllEnabled(this_00);
          if ((!bVar1) ||
             (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00), bVar1)) {
            this_local._4_4_ =
                 DynamicObject::DeleteProperty(&this->super_DynamicObject,propertyNameString,flags);
          }
          else {
            pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
            pcVar3 = JavascriptString::GetString(propertyNameString);
            JavascriptError::ThrowCantDeleteIfStrictMode(flags,pSVar2,pcVar3);
            this_local._4_4_ = 0;
          }
        }
        else {
          bVar1 = BuiltInPropertyRecord<7>::Equals
                            ((BuiltInPropertyRecord<7> *)BuiltInPropertyRecords::sticky,
                             propertyNameString);
          if (bVar1) {
            bVar1 = ScriptConfiguration::IsES6RegExStickyEnabled(this_00);
            if ((!bVar1) ||
               (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00), bVar1))
            {
              this_local._4_4_ =
                   DynamicObject::DeleteProperty
                             (&this->super_DynamicObject,propertyNameString,flags);
            }
            else {
              pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
              pcVar3 = JavascriptString::GetString(propertyNameString);
              JavascriptError::ThrowCantDeleteIfStrictMode(flags,pSVar2,pcVar3);
              this_local._4_4_ = 0;
            }
          }
          else {
            this_local._4_4_ =
                 DynamicObject::DeleteProperty(&this->super_DynamicObject,propertyNameString,flags);
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptRegExp::DeleteProperty(JavascriptString *propertyNameString, PropertyOperationFlags flags)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define DELETE_PROPERTY(ownProperty) \
        if (ownProperty) \
        { \
            JavascriptError::ThrowCantDeleteIfStrictMode(flags, this->GetScriptContext(), propertyNameString->GetString()); \
            return false; \
        } \
        return DynamicObject::DeleteProperty(propertyNameString, flags);

        if (BuiltInPropertyRecords::lastIndex.Equals(propertyNameString))
        {
            DELETE_PROPERTY(true);
        }
        else if (BuiltInPropertyRecords::global.Equals(propertyNameString)
            || BuiltInPropertyRecords::multiline.Equals(propertyNameString)
            || BuiltInPropertyRecords::ignoreCase.Equals(propertyNameString)
            || BuiltInPropertyRecords::source.Equals(propertyNameString)
            || BuiltInPropertyRecords::options.Equals(propertyNameString))
        {
            DELETE_PROPERTY(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        }
        else if (BuiltInPropertyRecords::unicode.Equals(propertyNameString))
        {
            DELETE_PROPERTY(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        }
        else if (BuiltInPropertyRecords::dotAll.Equals(propertyNameString))
        {
            DELETE_PROPERTY(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        }
        else if (BuiltInPropertyRecords::sticky.Equals(propertyNameString))
        {
            DELETE_PROPERTY(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        }
        else
        {
            return DynamicObject::DeleteProperty(propertyNameString, flags);
        }

#undef DELETE_PROPERTY

    }